

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O0

void __thiscall
lf::assemble::COOMatrix<double>::AddToEntry
          (COOMatrix<double> *this,gdof_idx_t i,gdof_idx_t j,double increment)

{
  size_type local_58;
  size_type local_50;
  int local_40;
  int local_3c;
  Triplet<double,_int> local_38;
  double local_28;
  double increment_local;
  gdof_idx_t j_local;
  gdof_idx_t i_local;
  COOMatrix<double> *this_local;
  
  local_3c = (int)i;
  if ((long)(ulong)this->rows_ < i + 1) {
    local_50 = local_3c + 1;
  }
  else {
    local_50 = this->rows_;
  }
  this->rows_ = local_50;
  local_40 = (int)j;
  if ((long)(ulong)this->cols_ < j + 1) {
    local_58 = local_40 + 1;
  }
  else {
    local_58 = this->cols_;
  }
  this->cols_ = local_58;
  local_28 = increment;
  increment_local = (double)j;
  j_local = i;
  i_local = (gdof_idx_t)this;
  Eigen::Triplet<double,_int>::Triplet(&local_38,&local_3c,&local_40,&local_28);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::push_back
            (&this->triplets_,&local_38);
  return;
}

Assistant:

void AddToEntry(gdof_idx_t i, gdof_idx_t j, SCALAR increment) {
    rows_ = (i + 1 > rows_) ? i + 1 : rows_;
    cols_ = (j + 1 > cols_) ? j + 1 : cols_;
    triplets_.push_back(Eigen::Triplet<SCALAR>(i, j, increment));
  }